

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutpolicy.cpp
# Opt level: O1

QDataStream * operator<<(QDataStream *stream,QLayoutPolicy *policy)

{
  uint uVar1;
  QDataStream *pQVar2;
  
  uVar1 = (policy->field_0).data;
  pQVar2 = (QDataStream *)
           QDataStream::operator<<
                     (stream,uVar1 << 0x18 | uVar1 >> 0x15 & 0x100 | uVar1 >> 0x10 & 0xff |
                             uVar1 >> 0xf & 0x3e00 | uVar1 >> 0x10 & 0x4000 | (uVar1 & 0xff00) << 8)
  ;
  return pQVar2;
}

Assistant:

QDataStream &operator<<(QDataStream &stream, const QLayoutPolicy &policy)
{
    // The order here is for historical reasons. (compatibility with Qt4)
    quint32 data = (policy.bits.horPolicy |         // [0, 3]
                    policy.bits.verPolicy << 4 |    // [4, 7]
                    policy.bits.hfw << 8 |          // [8]
                    policy.bits.ctype << 9 |        // [9, 13]
                    policy.bits.wfh << 14 |         // [14]
                  //policy.bits.padding << 15 |     // [15]
                    policy.bits.verStretch << 16 |  // [16, 23]
                    policy.bits.horStretch << 24);  // [24, 31]
    return stream << data;
}